

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redblacktree.h
# Opt level: O1

K __thiscall
snmalloc::
RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
::remove_min(RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
             *this)

{
  bool bVar1;
  long lVar2;
  K KVar3;
  RBPath path;
  undefined8 uStack_828;
  RBPath local_820;
  
  if (this->root < 0x200) {
    KVar3 = 0;
  }
  else {
    lVar2 = 8;
    do {
      *(undefined8 *)((long)local_820.path._M_elems + lVar2 + -8) = 0;
      *(undefined1 *)((long)&local_820.path._M_elems[0].node.ptr.val + lVar2) = 0;
      lVar2 = lVar2 + 0x10;
    } while (lVar2 != 0x808);
    local_820.path._M_elems[0].dir = false;
    local_820.length = 1;
    local_820.path._M_elems[0].node.ptr.val = (H)(H)this;
    do {
      bVar1 = RBPath::move(&local_820,true);
    } while (bVar1);
    KVar3 = *local_820.path._M_elems[local_820.length - 1].node.ptr.val & 0xfffffffffffffe00;
    remove_path(this,&local_820);
  }
  return KVar3;
}

Assistant:

bool is_null()
      {
        return Rep::get(ptr) == Rep::null;
      }